

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

size_t __thiscall
anon_unknown.dwarf_167e9d::filename_pos(anon_unknown_dwarf_167e9d *this,StringRef str,Style style)

{
  char cVar1;
  size_type sVar2;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  StringRef Chars;
  StringRef str_local;
  
  str_local.Length = (size_t)str.Data;
  iVar4 = (int)str.Length;
  str_local.Data = (char *)this;
  if ((char *)str_local.Length == (char *)0x0) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    cVar1 = llvm::StringRef::operator[](&str_local,(size_t)(str_local.Length + -1));
    if ((cVar1 == '/') || (iVar4 == 0 && cVar1 == '\\')) {
      return str_local.Length - 1;
    }
    sVar3 = str_local.Length - 1;
  }
  pcVar5 = "/";
  if (iVar4 == 0) {
    pcVar5 = "\\/";
  }
  Chars.Length = (ulong)(iVar4 == 0) + 1;
  Chars.Data = pcVar5;
  sVar2 = llvm::StringRef::find_last_of(&str_local,Chars,sVar3);
  if ((iVar4 == 0) && (sVar2 == 0xffffffffffffffff)) {
    sVar2 = llvm::StringRef::rfind(&str_local,':',str_local.Length - 2);
  }
  if (sVar2 == 0xffffffffffffffff) {
    sVar3 = 0;
  }
  else {
    if (sVar2 == 1) {
      cVar1 = llvm::StringRef::operator[](&str_local,0);
      if (cVar1 == '/') {
        return 0;
      }
      if (iVar4 == 0 && cVar1 == '\\') {
        return 0;
      }
    }
    sVar3 = sVar2 + 1;
  }
  return sVar3;
}

Assistant:

size_t filename_pos(StringRef str, Style style) {
    if (str.size() > 0 && is_separator(str[str.size() - 1], style))
      return str.size() - 1;

    size_t pos = str.find_last_of(separators(style), str.size() - 1);

    if (real_style(style) == Style::windows) {
      if (pos == StringRef::npos)
        pos = str.find_last_of(':', str.size() - 2);
    }

    if (pos == StringRef::npos || (pos == 1 && is_separator(str[0], style)))
      return 0;

    return pos + 1;
  }